

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall
CppGenerator::registerDependentComputationToLoops(CppGenerator *this,size_t depth,size_t group_id)

{
  pointer pbVar1;
  TreeDecomposition *this_00;
  pointer pvVar2;
  pointer puVar3;
  pointer pvVar4;
  pointer pAVar5;
  pointer ppVar6;
  var_bitset relationBag;
  dyn_bitset addedOutLoops_00;
  var_bitset varOrderBitset;
  pair<unsigned_long,_unsigned_long> *p;
  View *pVVar7;
  TDNode *pTVar8;
  size_t sVar9;
  pointer ppVar10;
  long lVar11;
  size_t *psVar12;
  undefined8 *puVar13;
  pointer puVar14;
  undefined8 *puVar15;
  AggregateTuple *depAgg;
  pointer pAVar16;
  byte bVar17;
  _Base_bitset<24UL> in_stack_fffffffffffffa88;
  pointer view_id;
  size_t *psVar18;
  size_t maxDepth;
  dyn_bitset contributingViews;
  dyn_bitset addedOutLoops;
  dyn_bitset consideredLoops;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_3e8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_3c8;
  prod_bitset presentFunctions;
  size_t currentLoop;
  DependentLoop depLoop;
  undefined8 local_f0 [24];
  
  bVar17 = 0;
  pbVar1 = (this->groupVariableOrderBitset).
           super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  maxDepth = (long)this->groupVariableOrder[group_id].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)this->groupVariableOrder[group_id].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  this_00 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVVar7 = QueryCompiler::getView
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,*(this->viewGroups).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[group_id].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  pTVar8 = TreeDecomposition::getRelation(this_00,(ulong)pVVar7->_origin);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::clear(&this->depListOfLoops);
  sVar9 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&consideredLoops,sVar9 + 1,0,(allocator<unsigned_long> *)&depLoop);
  sVar9 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  DependentLoop::DependentLoop(&depLoop,sVar9);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&depLoop.loopFactors,&consideredLoops);
  depLoop.loopVariable =
       QueryCompiler::numberOfViews
                 ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back
            (&this->depListOfLoops,&depLoop);
  pvVar2 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(pointer *)
            ((long)&pvVar2[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (puVar14 = pvVar2[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar14 != puVar3; puVar14 = puVar14 + 1)
  {
    view_id = (pointer)*puVar14;
    if (this->viewLevelRegister[(long)view_id] == depth) {
      memset(&presentFunctions.super__Base_bitset<24UL>,0,0xc0);
      sVar9 = QueryCompiler::numberOfViews
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&contributingViews,sVar9 + 1,0,(allocator<unsigned_long> *)&currentLoop);
      sVar9 = QueryCompiler::numberOfViews
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&addedOutLoops,sVar9 + 1,0,(allocator<unsigned_long> *)&currentLoop);
      pvVar4 = (this->aggregateComputation).
               super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar5 = *(pointer *)
                ((long)&pvVar4[(long)view_id].
                        super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (pAVar16 = pvVar4[(long)view_id].
                     super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                     super__Vector_impl_data._M_start; pAVar16 != pAVar5; pAVar16 = pAVar16 + 1) {
        std::_Base_bitset<24UL>::_M_do_or
                  (&presentFunctions.super__Base_bitset<24UL>,
                   (_Base_bitset<24UL> *)&pAVar16->dependentProdAgg);
        ppVar6 = *(pointer *)
                  ((long)&(pAVar16->dependentProdAgg).viewAggregate.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  + 8);
        for (ppVar10 = (pAVar16->dependentProdAgg).viewAggregate.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar6;
            ppVar10 = ppVar10 + 1) {
          contributingViews.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start[ppVar10->first >> 6] =
               contributingViews.m_bits.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[ppVar10->first >> 6] |
               1L << ((byte)ppVar10->first & 0x3f);
        }
      }
      memcpy(local_f0,&presentFunctions.super__Base_bitset<24UL>,0xc0);
      relationBag.super__Base_bitset<2UL>._M_w =
           *(_Base_bitset<2UL> *)(pTVar8->_bag).super__Base_bitset<2UL>._M_w;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_3e8,&contributingViews);
      varOrderBitset.super__Base_bitset<2UL>._M_w =
           *(_Base_bitset<2UL> *)pbVar1[group_id].super__Base_bitset<2UL>._M_w;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_3c8,&addedOutLoops);
      puVar13 = local_f0;
      puVar15 = (undefined8 *)&stack0xfffffffffffffa88;
      for (lVar11 = 0x18; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar15 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
      }
      addedOutLoops_00.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      addedOutLoops_00.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_3c8;
      addedOutLoops_00.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = view_id;
      addedOutLoops_00.m_num_bits = (size_type)puVar14;
      computeDependentLoops
                ((prod_bitset *)&currentLoop,this,(size_t)view_id,
                 (prod_bitset)in_stack_fffffffffffffa88._M_w,relationBag,&local_3e8,varOrderBitset,
                 addedOutLoops_00,depth);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3c8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3e8);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&addedOutLoops);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&contributingViews);
    }
  }
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear(&this->localProductList);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::clear(&this->localProductMap);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize(&this->localProductList,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this->depListOfLoops).
                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x138);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize(&this->localProductMap,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this->depListOfLoops).
                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x138);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear(&this->newAggregateRegister);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::clear(&this->aggregateRegisterMap);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize(&this->newAggregateRegister,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this->depListOfLoops).
                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x138);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize(&this->aggregateRegisterMap,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this->depListOfLoops).
                 super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x138);
  pvVar2 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar18 = *(pointer *)
             ((long)&pvVar2[group_id].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8);
  for (psVar12 = pvVar2[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; psVar12 != psVar18; psVar12 = psVar12 + 1
      ) {
    sVar9 = *psVar12;
    if (this->viewLevelRegister[sVar9] == depth) {
      pvVar4 = (this->aggregateComputation).
               super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar5 = *(pointer *)
                ((long)&pvVar4[sVar9].
                        super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (pAVar16 = pvVar4[sVar9].
                     super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                     super__Vector_impl_data._M_start; pAVar16 != pAVar5; pAVar16 = pAVar16 + 1) {
        currentLoop = 0;
        presentFunctions.super__Base_bitset<24UL>._M_w[0] =
             ((long)(this->depListOfLoops).
                    super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->depListOfLoops).
                   super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x138;
        presentFunctions.super__Base_bitset<24UL>._M_w[1] = 0;
        addDependentProductToLoop
                  (this,&pAVar16->dependentProdAgg,sVar9,&currentLoop,&maxDepth,
                   (pair<unsigned_long,_unsigned_long> *)&presentFunctions);
        (pAVar16->dependentProdAgg).correspondingLoopAgg.first =
             presentFunctions.super__Base_bitset<24UL>._M_w[0];
        (pAVar16->dependentProdAgg).correspondingLoopAgg.second =
             presentFunctions.super__Base_bitset<24UL>._M_w[1];
      }
    }
  }
  DependentLoop::~DependentLoop(&depLoop);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&consideredLoops);
  return;
}

Assistant:

void CppGenerator::registerDependentComputationToLoops(size_t depth, size_t group_id)
{
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    const size_t maxDepth = groupVariableOrder[group_id].size();
    const var_bitset& relationBag =
        _td->getRelation(_qc->getView(viewGroups[group_id][0])->_origin)->_bag;

    depListOfLoops.clear();


    dyn_bitset consideredLoops(_qc->numberOfViews()+1);

    // add empty loop to the list of dependentLoops
    DependentLoop depLoop(_qc->numberOfViews());
    depLoop.loopFactors = consideredLoops;
    depLoop.loopVariable = _qc->numberOfViews();
    
    depListOfLoops.push_back(depLoop);

    // Go over each view that can be outputted at this depth 
    for (const size_t viewID : viewGroups[group_id])
    {
        if (viewLevelRegister[viewID] == depth)
        {
            // go through the ProductAggregates and find functions computed here 
            prod_bitset presentFunctions;
            dyn_bitset contributingViews(_qc->numberOfViews()+1);
            dyn_bitset addedOutLoops(_qc->numberOfViews()+1);

            // Check for all aggregates of that view what dependent computation
            // it requires
            for (const AggregateTuple& depAgg : aggregateComputation[viewID])
            {
                presentFunctions |= depAgg.dependentProdAgg.product;
                for (const auto& p : depAgg.dependentProdAgg.viewAggregate)
                    contributingViews.set(p.first);
            }

            
            // Compute the loops for the dependent computation of this
            // output view
            computeDependentLoops(viewID,presentFunctions,relationBag,contributingViews,
                                  varOrderBitset,addedOutLoops,0);
        }
    }

    // reset the List and Maps for aggregates
    localProductList.clear();
    localProductMap.clear();
    localProductList.resize(depListOfLoops.size());
    localProductMap.resize(depListOfLoops.size());
    
    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    newAggregateRegister.resize(depListOfLoops.size());
    aggregateRegisterMap.resize(depListOfLoops.size());


    // add the aggregates needed for views outputted at this level to the loops
    for (const size_t viewID : viewGroups[group_id])
    {
        if (viewLevelRegister[viewID] == depth)
        {
            for (AggregateTuple& depAgg : aggregateComputation[viewID])
            {
                ProductAggregate& prodAgg = depAgg.dependentProdAgg;

                size_t currentLoop = 0;
                std::pair<size_t, size_t> prevAgg = {depListOfLoops.size(), 0};
                
                addDependentProductToLoop(
                    prodAgg, viewID, currentLoop, maxDepth, prevAgg);

                prodAgg.correspondingLoopAgg = prevAgg;
            }
        }
    }
}